

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QGraphicsAnchorLayoutPrivate::removeCenterAnchors
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint centerEdge,
          bool substitute)

{
  QGraphicsLayoutItem *pQVar1;
  Data *pDVar2;
  Data *this_00;
  bool bVar3;
  Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *pNVar4;
  AnchorData *pAVar5;
  Node<QSimplexVariable_*,_double> *pNVar6;
  QSimplexConstraint *this_01;
  undefined1 *puVar7;
  uint uVar8;
  AnchorVertex *pAVar9;
  AnchorVertex *pAVar10;
  AnchorPoint secondEdge;
  AnchorVertex *first;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_02;
  long lVar11;
  AnchorPoint firstEdge;
  ulong i;
  undefined1 *puVar12;
  QGraphicsLayoutItem *pQVar13;
  long in_FS_OFFSET;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_68;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  if (centerEdge == AnchorVerticalCenter) {
    firstEdge = AnchorTop;
    lVar11 = 1;
    secondEdge = AnchorBottom;
  }
  else {
    if (centerEdge != AnchorHorizontalCenter) goto LAB_005bfde7;
    lVar11 = 0;
    secondEdge = AnchorRight;
    firstEdge = AnchorLeft;
  }
  local_68.d.ptr = (AnchorVertex **)CONCAT44(local_68.d.ptr._4_4_,centerEdge);
  pDVar2 = (this->m_vertexList).d;
  local_68.d.d = (Data *)item;
  if (((pDVar2 != (Data *)0x0) &&
      (pNVar4 = QHashPrivate::
                Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                          ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                            *)pDVar2,(pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *)&local_68),
      pNVar4 != (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                 *)0x0)) && (pAVar10 = (pNVar4->value).first, pAVar10 != (AnchorVertex *)0x0)) {
    local_68.d.ptr = (AnchorVertex **)CONCAT44(local_68.d.ptr._4_4_,firstEdge);
    pDVar2 = (this->m_vertexList).d;
    local_68.d.d = (Data *)item;
    if ((pDVar2 == (Data *)0x0) ||
       (pNVar4 = QHashPrivate::
                 Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                 ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                           ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                             *)pDVar2,(pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *)&local_68),
       pNVar4 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                  *)0x0)) {
      first = (AnchorVertex *)0x0;
    }
    else {
      first = (pNVar4->value).first;
    }
    this_02 = (this->graph).m_data + lVar11;
    pAVar5 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_02,first,pAVar10);
    uVar8 = (int)(this->itemCenterConstraints).m_data[lVar11].d.size - 1;
    if (-1 < (int)uVar8) {
      pQVar13 = (QGraphicsLayoutItem *)&pAVar5->super_QSimplexVariable;
      if (pAVar5 == (AnchorData *)0x0) {
        pQVar13 = (QGraphicsLayoutItem *)0x0;
      }
      i = (ulong)uVar8;
      do {
        this_00 = ((this->itemCenterConstraints).m_data[lVar11].d.ptr[i]->variables).d;
        local_68.d.d = (Data *)pQVar13;
        if ((this_00 != (Data *)0x0) &&
           (pNVar6 = QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable*,double>>::
                     findNode<QSimplexVariable*>
                               ((Data<QHashPrivate::Node<QSimplexVariable*,double>> *)this_00,
                                (QSimplexVariable **)&local_68),
           pNVar6 != (Node<QSimplexVariable_*,_double> *)0x0)) {
          this_01 = QList<QSimplexConstraint_*>::takeAt
                              ((this->itemCenterConstraints).m_data + lVar11,i);
          if (this_01 != (QSimplexConstraint *)0x0) {
            QHash<QSimplexVariable_*,_double>::~QHash(&this_01->variables);
          }
          operator_delete(this_01,0x30);
          break;
        }
        bVar3 = 0 < (long)i;
        i = i - 1;
      } while (bVar3);
    }
    if (substitute) {
      pAVar5 = (AnchorData *)operator_new(0x80);
      (pAVar5->super_QSimplexVariable).result = 0.0;
      (pAVar5->super_QSimplexVariable).index = 0;
      pAVar5->_vptr_AnchorData = (_func_int **)&PTR__AnchorData_00811180;
      pAVar5->from = (AnchorVertex *)0x0;
      pAVar5->to = (AnchorVertex *)0x0;
      pAVar5->minSize = 0.0;
      pAVar5->prefSize = 0.0;
      pAVar5->maxSize = 0.0;
      pAVar5->minPrefSize = 0.0;
      pAVar5->maxPrefSize = 0.0;
      pAVar5->sizeAtMinimum = 0.0;
      pAVar5->sizeAtPreferred = 0.0;
      pAVar5->sizeAtMaximum = 0.0;
      pAVar5->item = (QGraphicsLayoutItem *)0x0;
      pAVar5->graphicsAnchor = (QGraphicsAnchor *)0x0;
      pAVar5->field_0x78 = 0;
      addAnchor_helper(this,item,firstEdge,item,secondEdge,pAVar5);
      pAVar9 = (AnchorVertex *)0x0;
      QtGraphicsAnchorLayout::AnchorData::refreshSizeHints(pAVar5,(QLayoutStyleInfo *)0x0);
      removeAnchor_helper(this,first,pAVar10);
      local_68.d.ptr = (AnchorVertex **)CONCAT44(local_68.d.ptr._4_4_,secondEdge);
      pDVar2 = (this->m_vertexList).d;
      local_68.d.d = (Data *)item;
      if (pDVar2 != (Data *)0x0) {
        pNVar4 = QHashPrivate::
                 Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                 ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                           ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                             *)pDVar2,(pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *)&local_68);
        if (pNVar4 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                       *)0x0) {
          pAVar9 = (AnchorVertex *)0x0;
        }
        else {
          pAVar9 = (pNVar4->value).first;
        }
      }
      removeAnchor_helper(this,pAVar10,pAVar9);
    }
    else {
      local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices(&local_68,this_02,pAVar10);
      if ((undefined1 *)local_68.d.size != (undefined1 *)0x0) {
        puVar12 = (undefined1 *)0x0;
        puVar7 = (undefined1 *)local_68.d.size;
        do {
          local_48.first = local_68.d.ptr[(long)puVar12]->m_item;
          if (local_48.first != item) {
            local_48.second = local_68.d.ptr[(long)puVar12]->m_edge;
            pDVar2 = (this->m_vertexList).d;
            if ((pDVar2 == (Data *)0x0) ||
               (pNVar4 = QHashPrivate::
                         Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                         ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                                   ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                                     *)pDVar2,&local_48),
               pNVar4 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                          *)0x0)) {
              pAVar9 = (AnchorVertex *)0x0;
            }
            else {
              pAVar9 = (pNVar4->value).first;
            }
            removeAnchor_helper(this,pAVar10,pAVar9);
            puVar7 = (undefined1 *)local_68.d.size;
          }
          puVar12 = puVar12 + 1;
        } while (puVar12 < puVar7);
      }
      pDVar2 = (this->m_vertexList).d;
      local_48.first = item;
      local_48.second = secondEdge;
      if ((pDVar2 == (Data *)0x0) ||
         (pNVar4 = QHashPrivate::
                   Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                   ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                             ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                               *)pDVar2,&local_48),
         pNVar4 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                    *)0x0)) {
        pAVar10 = (AnchorVertex *)0x0;
      }
      else {
        pAVar10 = (pNVar4->value).first;
      }
      removeAnchor_helper(this,first,pAVar10);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
    if (pQVar1 == item) {
      (this->layoutCentralVertex).m_data[lVar11] = (AnchorVertex *)0x0;
    }
  }
LAB_005bfde7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeCenterAnchors(
    QGraphicsLayoutItem *item, Qt::AnchorPoint centerEdge,
    bool substitute)
{
    Q_Q(QGraphicsAnchorLayout);

    Qt::Orientation orientation;
    switch (centerEdge) {
    case Qt::AnchorHorizontalCenter:
        orientation = Qt::Horizontal;
        break;
    case Qt::AnchorVerticalCenter:
        orientation = Qt::Vertical;
        break;
    default:
        // Don't remove edges that not the center ones
        return;
    }

    // Orientation code
    Qt::AnchorPoint firstEdge;
    Qt::AnchorPoint lastEdge;

    if (orientation == Qt::Horizontal) {
        firstEdge = Qt::AnchorLeft;
        lastEdge = Qt::AnchorRight;
    } else {
        firstEdge = Qt::AnchorTop;
        lastEdge = Qt::AnchorBottom;
    }

    AnchorVertex *center = internalVertex(item, centerEdge);
    if (!center)
        return;
    AnchorVertex *first = internalVertex(item, firstEdge);

    Q_ASSERT(first);
    Q_ASSERT(center);

    Graph<AnchorVertex, AnchorData> &g = graph[orientation];


    AnchorData *oldData = g.edgeData(first, center);
    // Remove center constraint
    for (int i = itemCenterConstraints[orientation].size() - 1; i >= 0; --i) {
        if (itemCenterConstraints[orientation].at(i)->variables.contains(oldData)) {
            delete itemCenterConstraints[orientation].takeAt(i);
            break;
        }
    }

    if (substitute) {
        // Create the new anchor that should substitute the left-center-right anchors.
        AnchorData *data = new AnchorData;
        addAnchor_helper(item, firstEdge, item, lastEdge, data);
        data->refreshSizeHints();

        // Remove old anchors
        removeAnchor_helper(first, center);
        removeAnchor_helper(center, internalVertex(item, lastEdge));

    } else {
        // this is only called from removeAnchors()
        // first, remove all non-internal anchors
        QList<AnchorVertex*> adjacents = g.adjacentVertices(center);
        for (int i = 0; i < adjacents.size(); ++i) {
            AnchorVertex *v = adjacents.at(i);
            if (v->m_item != item) {
                removeAnchor_helper(center, internalVertex(v->m_item, v->m_edge));
            }
        }
        // when all non-internal anchors is removed it will automatically merge the
        // center anchor into a left-right (or top-bottom) anchor. We must also delete that.
        // by this time, the center vertex is deleted and merged into a non-centered internal anchor
        removeAnchor_helper(first, internalVertex(item, lastEdge));
    }

    if (item == q) {
        layoutCentralVertex[orientation] = nullptr;
    }
}